

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ValueDriver * __thiscall
slang::BumpAllocator::emplace<slang::ast::ValueDriver,slang::ast::ValueDriver_const&>
          (BumpAllocator *this,ValueDriver *args)

{
  undefined8 uVar1;
  ValueDriver *pVVar2;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pVVar2 = (ValueDriver *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  (pVVar2->prefixExpression).ptr = (Expression *)*in_RSI;
  (pVVar2->containingSymbol).ptr = (Symbol *)in_RSI[1];
  pVVar2->procCallExpression = (Expression *)in_RSI[2];
  uVar1 = in_RSI[3];
  pVVar2->flags = (bitmask<slang::ast::AssignFlags>)(char)uVar1;
  pVVar2->kind = (char)((ulong)uVar1 >> 8);
  pVVar2->source = (char)((ulong)uVar1 >> 0x10);
  pVVar2->isFromSideEffect = (bool)(char)((ulong)uVar1 >> 0x18);
  *(int *)&pVVar2->field_0x1c = (int)((ulong)uVar1 >> 0x20);
  return pVVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }